

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chess.cpp
# Opt level: O3

void __thiscall
banksia::ChessBoard::gen_addMove
          (ChessBoard *this,vector<banksia::MoveFull,_std::allocator<banksia::MoveFull>_> *moveList,
          int from,int dest,bool captureOnly)

{
  pointer *ppMVar1;
  pointer pPVar2;
  Piece PVar3;
  iterator __position;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  MoveFull local_14;
  
  uVar5 = (ulong)dest;
  pPVar2 = (this->super_BoardCore).pieces.
           super__Vector_base<banksia::Piece,_std::allocator<banksia::Piece>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = (long)(this->super_BoardCore).pieces.
                super__Vector_base<banksia::Piece,_std::allocator<banksia::Piece>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pPVar2 >> 3;
  uVar6 = uVar5;
  if ((uVar5 < uVar4) && (uVar6 = (ulong)from, uVar6 < uVar4)) {
    PVar3 = pPVar2[uVar6];
    local_14.piece.side = PVar3.side;
    if ((local_14.piece.side != pPVar2[uVar5].side) &&
       ((ulong)pPVar2[uVar5] >> 0x20 != 2 || !captureOnly)) {
      local_14.super_Move.promotion = empty;
      local_14.piece.type = PVar3.type;
      __position._M_current =
           (moveList->super__Vector_base<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (moveList->super__Vector_base<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        local_14.super_Move.from = from;
        local_14.super_Move.dest = dest;
        std::vector<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>::
        _M_realloc_insert<banksia::MoveFull>(moveList,__position,&local_14);
      }
      else {
        ((__position._M_current)->piece).side = local_14.piece.side;
        ((__position._M_current)->super_Move).from = from;
        ((__position._M_current)->super_Move).dest = dest;
        *(long *)&((__position._M_current)->super_Move).promotion = (long)PVar3 << 0x20;
        ppMVar1 = &(moveList->
                   super__Vector_base<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppMVar1 = *ppMVar1 + 1;
      }
    }
    return;
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar6,uVar4
            );
}

Assistant:

void ChessBoard::gen_addMove(std::vector<MoveFull>& moveList, int from, int dest, bool captureOnly) const
{
    auto toSide = getPiece(dest).side;
    auto movingPiece = getPiece(from);
    auto fromSide = movingPiece.side;
    
    if (fromSide != toSide && (!captureOnly || toSide != Side::none)) {
        moveList.push_back(MoveFull(movingPiece, from, dest));
    }
}